

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importsource.cpp
# Opt level: O0

bool __thiscall libcellml::ImportSource::doEquals(ImportSource *this,EntityPtr *other)

{
  bool bVar1;
  ImportSourceImpl *pIVar2;
  element_type *this_00;
  string local_60;
  undefined1 local_30 [8];
  shared_ptr<libcellml::ImportSource> importSource;
  EntityPtr *other_local;
  ImportSource *this_local;
  
  importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)other;
  bVar1 = Entity::doEquals(&this->super_Entity,other);
  if (bVar1) {
    std::dynamic_pointer_cast<libcellml::ImportSource,libcellml::Entity>
              ((shared_ptr<libcellml::Entity> *)local_30);
    bVar1 = std::operator!=((shared_ptr<libcellml::ImportSource> *)local_30,(nullptr_t)0x0);
    if (bVar1) {
      pIVar2 = pFunc(this);
      this_00 = std::
                __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_30);
      url_abi_cxx11_(&local_60,this_00);
      this_local._7_1_ = std::operator==(&pIVar2->mUrl,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)local_30);
    if (bVar1) goto LAB_0031d3db;
  }
  this_local._7_1_ = 0;
LAB_0031d3db:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ImportSource::doEquals(const EntityPtr &other) const
{
    if (Entity::doEquals(other)) {
        auto importSource = std::dynamic_pointer_cast<ImportSource>(other);
        if (importSource != nullptr) {
            return pFunc()->mUrl == importSource->url();
        }
    }
    return false;
}